

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui.cpp
# Opt level: O0

void ui_begin(float dt,float row,float sec)

{
  uint values_offset;
  bool bVar1;
  float fVar2;
  float fVar3;
  ImVec2 local_2c;
  bool local_21;
  ImGuiIO *pIStack_20;
  bool show_demo_window;
  ImGuiIO *io;
  float local_10;
  float sec_local;
  float row_local;
  float dt_local;
  
  g.frame_times[g.frame_times_cursor] = dt * 1000.0;
  g.frame_times_cursor = g.frame_times_cursor + 1 & 0x1ff;
  io._4_4_ = sec;
  local_10 = row;
  sec_local = dt;
  ImGui_ImplOpenGL2_NewFrame();
  pIStack_20 = ImGui::GetIO();
  pIStack_20->DeltaTime = sec_local;
  bVar1 = ImFontAtlas::IsBuilt(pIStack_20->Fonts);
  if (!bVar1) {
    __assert_fail("io.Fonts->IsBuilt() && \"Font atlas not built! It is generally built by the renderer back-end. Missing call to renderer _NewFrame() function? e.g. ImGui_ImplOpenGL3_NewFrame().\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/w23[P]stameska/src/ui.cpp"
                  ,0x5b,"void ui_begin(float, float, float)");
  }
  ImGui::NewFrame();
  local_21 = true;
  ImGui::ShowDemoWindow(&local_21);
  values_offset = g.frame_times_cursor;
  ImVec2::ImVec2(&local_2c,0.0,100.0);
  ImGui::PlotLines("frame time",g.frame_times,0x200,values_offset,(char *)0x0,0.0,3.4028235e+38,
                   local_2c,4);
  ImGui::LabelText("","dt: %.3fms",(double)(sec_local * 1000.0));
  ImGui::LabelText("","fps: %.3f",(double)(1.0 / sec_local));
  ImGui::LabelText("","row: %d",(ulong)(uint)(int)local_10);
  fVar2 = io._4_4_ / 60.0;
  fVar3 = fmodf(io._4_4_,60.0);
  ImGui::LabelText("","t: %02d:%06.3f",(double)fVar3,(ulong)(uint)(int)fVar2);
  return;
}

Assistant:

void ui_begin(float dt, float row, float sec) {
	g.frame_times[g.frame_times_cursor] = dt * 1000.f;
	g.frame_times_cursor = (g.frame_times_cursor + 1) % COUNTOF(g.frame_times);
	// if (ImGui::Button("Save"))
	// 			MySaveFunction();
	// ImGui::InputText("string", buf, IM_ARRAYSIZE(buf));
	// ImGui::SliderFloat("float", &f, 0.0f, 1.0f);

	{
		ImGui_ImplOpenGL2_NewFrame();
		ImGuiIO& io = ImGui::GetIO();
		io.DeltaTime = dt;
		IM_ASSERT(io.Fonts->IsBuilt() && "Font atlas not built! It is generally built by the renderer back-end. Missing call to renderer _NewFrame() function? e.g. ImGui_ImplOpenGL3_NewFrame().");

		ImGui::NewFrame();
	}

	//ImGui::Text("Hello, world %d", 123);
	bool show_demo_window = true;
	ImGui::ShowDemoWindow(&show_demo_window);

	ImGui::PlotLines("frame time", g.frame_times, COUNTOF(g.frame_times), g.frame_times_cursor, NULL, 0, FLT_MAX, ImVec2(0, 100));
	ImGui::LabelText("", "dt: %.3fms", 1000.f * dt);
	ImGui::LabelText("", "fps: %.3f", 1.f / dt);
	ImGui::LabelText("", "row: %d", (int)row);
	ImGui::LabelText("", "t: %02d:%06.3f", (int)(sec/60), fmodf(sec,60.f));
}